

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * get_next_command_abi_cxx11_(void)

{
  bool bVar1;
  char *__s;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_31;
  string val;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,"quit",(allocator<char> *)&val);
  if ((((&std::exception::typeinfo)[*(long *)(std::cin + -0x18)] & 2) == 0) &&
     (__s = (char *)readline("eval> "), __s != (char *)0x0)) {
    add_history(__s);
    std::__cxx11::string::string<std::allocator<char>>((string *)&val,__s,&local_31);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of(&val,"\t \n",0);
    if (sVar2 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&val,0,sVar2);
    }
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(&val,"\t \n",0xffffffffffffffff);
    if (sVar2 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&val,sVar2 + 1,0xffffffffffffffff);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (in_RDI,&val);
    free(__s);
    std::__cxx11::string::~string((string *)&val);
  }
  bVar1 = std::operator==(in_RDI,"quit");
  if ((((!bVar1) && (bVar1 = std::operator==(in_RDI,"exit"), !bVar1)) &&
      (bVar1 = std::operator==(in_RDI,"help"), !bVar1)) &&
     (bVar1 = std::operator==(in_RDI,"version"), !bVar1)) {
    return in_RDI;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_RDI,"(0)");
  return in_RDI;
}

Assistant:

std::string get_next_command() {
  std::string retval("quit");
  if (!std::cin.eof()) {
    char *input_raw = readline("eval> ");
    if (input_raw != nullptr) {
      add_history(input_raw);

      std::string val(input_raw);
      size_t pos = val.find_first_not_of("\t \n");
      if (pos != std::string::npos) {
        val.erase(0, pos);
      }
      pos = val.find_last_not_of("\t \n");
      if (pos != std::string::npos) {
        val.erase(pos + 1, std::string::npos);
      }

      retval = val;

      ::free(input_raw);
    }
  }
  if (retval == "quit" || retval == "exit" || retval == "help" || retval == "version") {
    retval += "(0)";
  }
  return retval;
}